

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::EventLoop::enterScope(EventLoop *this)

{
  long *in_FS_OFFSET;
  Fault f;
  DebugComparison<kj::EventLoop_*&,_std::nullptr_t> _kjCondition;
  
  _kjCondition.left = (EventLoop **)(*in_FS_OFFSET + -0x28);
  _kjCondition.result = in_FS_OFFSET[-5] == 0;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    in_FS_OFFSET[-5] = (long)this;
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*&,decltype(nullptr)>&,char_const(&)[38]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x74b,FAILED,"threadLocalEventLoop == nullptr",
             "_kjCondition,\"This thread already has an EventLoop.\"",&_kjCondition,
             (char (*) [38])"This thread already has an EventLoop.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void EventLoop::enterScope() {
  KJ_REQUIRE(threadLocalEventLoop == nullptr, "This thread already has an EventLoop.");
  threadLocalEventLoop = this;
}